

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O1

void ctemplate::AssertExpandWithDataIs
               (Template *tpl,TemplateDictionary *dict,PerExpandData *per_expand_data,string *is,
               bool expected)

{
  char *__s2;
  int iVar1;
  char *__s1;
  bool bVar2;
  allocator local_41;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  __s1 = ExpandIs(tpl,dict,per_expand_data,expected);
  __s2 = (is->_M_dataplus)._M_p;
  iVar1 = strcmp(__s1,__s2);
  if (iVar1 != 0) {
    printf("expected = \'%s\'\n",__s2);
    printf("actual   = \'%s\'\n",__s1);
  }
  std::__cxx11::string::string((string *)&local_40,__s1,&local_41);
  if (local_38 == is->_M_string_length) {
    if (local_38 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_40,(is->_M_dataplus)._M_p,local_38);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (bVar2) {
    operator_delete__(__s1);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xcb,"string(buf) == is");
  std::__cxx11::string::string((string *)&local_40,__s1,&local_41);
  if (local_38 == is->_M_string_length) {
    if (local_38 != 0) {
      iVar1 = bcmp(local_40,(is->_M_dataplus)._M_p,local_38);
      if (iVar1 != 0) goto LAB_00113e50;
    }
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
LAB_00113e50:
  __assert_fail("string(buf) == is",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                ,0xcb,
                "void ctemplate::AssertExpandWithDataIs(const Template *, const TemplateDictionary *, PerExpandData *, const string &, bool)"
               );
}

Assistant:

void AssertExpandWithDataIs(const Template* tpl,
                            const TemplateDictionary *dict,
                            PerExpandData* per_expand_data,
                            const string& is, bool expected) {
  const char* buf = ExpandIs(tpl, dict, per_expand_data, expected);
  if (strcmp(buf, is.c_str())) {
    printf("expected = '%s'\n", is.c_str());
    printf("actual   = '%s'\n", buf);
  }
  ASSERT(string(buf) == is);
  delete [] buf;
}